

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Belief.cpp
# Opt level: O1

void __thiscall Belief::Belief(Belief *this,vector<double,_std::allocator<double>_> *belief)

{
  SDV *this_00;
  
  *(undefined ***)this = &PTR__Belief_005cb588;
  this_00 = &(this->_m_b).super_SDV;
  (this->_m_b).super_SDV.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_m_b).super_SDV.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_m_b).super_SDV.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_m_b).super_StateDistribution._vptr_StateDistribution =
       (_func_int **)&PTR__StateDistributionVector_0059cb98;
  if (this_00 != belief) {
    std::vector<double,_std::allocator<double>_>::operator=(this_00,belief);
  }
  return;
}

Assistant:

Belief::Belief(const vector<double> &belief)
{
    _m_b=belief;
#if Belief_CheckAndAbort
    if(!SanityCheck())
        abort();
#endif
}